

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Fillet3.cpp
# Opt level: O2

double __thiscall chrono::ChFunction_Fillet3::Get_y_dx(ChFunction_Fillet3 *this,double x)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  dVar2 = 0.0;
  if ((0.0 < x) && (x < this->end)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (this->c2 + this->c2) * x;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->c1 * 3.0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = x * x;
    auVar1 = vfmadd231sd_fma(auVar1,auVar3,auVar4);
    dVar2 = auVar1._0_8_ + this->c3;
  }
  return dVar2;
}

Assistant:

double ChFunction_Fillet3::Get_y_dx(double x) const {
    double ret = 0;
    if (x <= 0)
        return 0;
    if (x >= end)
        return 0;
    ret = 3 * c1 * pow(x, 2) + 2 * c2 * x + c3;
    return ret;
}